

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O0

Stream * rw::readSkin(Stream *stream,int32 len,void *object,int32 offset,int32 param_5)

{
  Skin *this;
  bool bVar1;
  int local_50;
  int32 i;
  bool oldFormat;
  Skin *skin;
  Geometry *geometry;
  int32 local_30;
  uint8 header [4];
  int32 param_4_local;
  int32 offset_local;
  void *object_local;
  int32 len_local;
  Stream *stream_local;
  
  local_30 = param_5;
  header = (uint8  [4])offset;
  if (*(long *)((long)object + 0x98) == 0) {
    (*stream->_vptr_Stream[4])(stream,(long)&geometry + 4,4);
    this = (Skin *)mustmalloc_LOC(0x70,0x30116,
                                  "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/skin.cpp line: 137"
                                 );
    *(Skin **)((long)object + (long)(int)header) = this;
    bVar1 = geometry._5_1_ == '\0';
    if (bVar1) {
      Skin::init(this,(EVP_PKEY_CTX *)(ulong)geometry._4_1_);
    }
    else {
      Skin::init(this,(EVP_PKEY_CTX *)(ulong)geometry._4_1_);
    }
    this->numWeights = (uint)geometry._6_1_;
    if (!bVar1) {
      (*stream->_vptr_Stream[4])(stream,this->usedBones,(ulong)(uint)this->numUsedBones);
    }
    if (this->indices != (uint8 *)0x0) {
      (*stream->_vptr_Stream[4])
                (stream,this->indices,(ulong)(uint)(*(int *)((long)object + 0x1c) << 2));
    }
    if (this->weights != (float *)0x0) {
      Stream::read32(stream,this->weights,*(int *)((long)object + 0x1c) << 4);
    }
    for (local_50 = 0; local_50 < this->numBones; local_50 = local_50 + 1) {
      if (bVar1) {
        (*stream->_vptr_Stream[5])(stream,4,1);
      }
      Stream::read32(stream,this->inverseMatrices + (local_50 << 4),0x40);
    }
    stream_local = stream;
    if (bVar1) {
      Skin::findNumWeights(this,*(int32 *)((long)object + 0x1c));
      Skin::findUsedBones(this,*(int32 *)((long)object + 0x1c));
    }
    else {
      readSkinSplitData(stream,this);
    }
  }
  else if (**(int **)((long)object + 0x98) == 4) {
    stream_local = ps2::readNativeSkin(stream,len,object,offset);
  }
  else if (**(int **)((long)object + 0x98) == 0xb) {
    stream_local = wdgl::readNativeSkin(stream,len,object,offset);
  }
  else if (**(int **)((long)object + 0x98) == 5) {
    stream_local = xbox::readNativeSkin(stream,len,object,offset);
  }
  else {
    stream_local = (Stream *)0x0;
  }
  return stream_local;
}

Assistant:

static Stream*
readSkin(Stream *stream, int32 len, void *object, int32 offset, int32)
{
	uint8 header[4];
	Geometry *geometry = (Geometry*)object;

	if(geometry->instData){
		// TODO: function pointers
		if(geometry->instData->platform == PLATFORM_PS2)
			return ps2::readNativeSkin(stream, len, object, offset);
		else if(geometry->instData->platform == PLATFORM_WDGL)
			return wdgl::readNativeSkin(stream, len, object, offset);
		else if(geometry->instData->platform == PLATFORM_XBOX)
			return xbox::readNativeSkin(stream, len, object, offset);
		else{
			assert(0 && "unsupported native skin platform");
			return nil;
		}
	}

	stream->read8(header, 4);  // numBones, numUsedBones,
	                          // numWeights, unused
	Skin *skin = rwNewT(Skin, 1, MEMDUR_EVENT | ID_SKIN);
	*PLUGINOFFSET(Skin*, geometry, offset) = skin;

	// numUsedBones and numWeights appear in/after 34003
	// but not in/before 33002 (probably rw::version >= 0x34000)
	bool oldFormat = header[1] == 0;

	// Use numBones for numUsedBones to allocate data,
	// find out the correct value later
	if(oldFormat)
		skin->init(header[0], header[0], geometry->numVertices);
	else
		skin->init(header[0], header[1], geometry->numVertices);
	skin->numWeights = header[2];

	if(!oldFormat)
		stream->read8(skin->usedBones, skin->numUsedBones);
	if(skin->indices)
		stream->read8(skin->indices, geometry->numVertices*4);
	if(skin->weights)
		stream->read32(skin->weights, geometry->numVertices*16);
	for(int32 i = 0; i < skin->numBones; i++){
		if(oldFormat)
			stream->seek(4);	// skip 0xdeaddead
		stream->read32(&skin->inverseMatrices[i*16], 64);
	}

	if(oldFormat){
		skin->findNumWeights(geometry->numVertices);
		skin->findUsedBones(geometry->numVertices);
	}

	if(!oldFormat)
		readSkinSplitData(stream, skin);

	return stream;
}